

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteJson(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName;
  bool bVar1;
  int iVar2;
  Abc_Frame_t *pAVar3;
  Abc_Nam_t *pAVar4;
  Vec_Wec_t *vObjs;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ch"), iVar2 == 99) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    pAVar3 = Abc_FrameReadGlobalFrame();
    pAVar4 = Abc_FrameReadJsonStrs(pAVar3);
    if (pAVar4 == (Abc_Nam_t *)0x0) {
      fwrite("No JSON info is available.\n",0x1b,1,(FILE *)pAbc->Out);
      return 0;
    }
    if (globalUtilOptind + 1 == argc) {
      pFileName = argv[globalUtilOptind];
      pAVar3 = Abc_FrameReadGlobalFrame();
      pAVar4 = Abc_FrameReadJsonStrs(pAVar3);
      pAVar3 = Abc_FrameReadGlobalFrame();
      vObjs = Abc_FrameReadJsonObjs(pAVar3);
      if (bVar1) {
        Json_Extract(pFileName,pAVar4,vObjs);
        return 0;
      }
      Json_Write(pFileName,pAVar4,vObjs);
      return 0;
    }
  }
  fwrite("usage: write_json [-ch] <file>\n",0x1f,1,(FILE *)pAbc->Err);
  fwrite("\t         write the network in JSON format\n",0x2b,1,(FILE *)pAbc->Err);
  fwrite("\t-c     : output extracted version\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\t-h     : print the help message\n",0x21,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of the file to write (extension .json)\n",0x3a,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandWriteJson( Abc_Frame_t * pAbc, int argc, char **argv )
{
    extern void Json_Write( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs );
    extern void Json_Extract( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs );
    int c, fExtract = 0;
    char * pFileName;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fExtract ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()) == NULL )
    {
        fprintf( pAbc->Out, "No JSON info is available.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    pFileName = argv[globalUtilOptind];
    if ( fExtract )
        Json_Extract( pFileName, Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()), Abc_FrameReadJsonObjs(Abc_FrameReadGlobalFrame()) );
    else
        Json_Write( pFileName, Abc_FrameReadJsonStrs(Abc_FrameReadGlobalFrame()), Abc_FrameReadJsonObjs(Abc_FrameReadGlobalFrame()) );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_json [-ch] <file>\n" );
    fprintf( pAbc->Err, "\t         write the network in JSON format\n" );
    fprintf( pAbc->Err, "\t-c     : output extracted version\n" );
    fprintf( pAbc->Err, "\t-h     : print the help message\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .json)\n" );
    return 1;
}